

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

uint pugi::impl::anon_unknown_0::hash_string(char_t *str)

{
  uint uVar1;
  uint result;
  char_t *str_local;
  
  result = 0;
  for (str_local = str; *str_local != '\0'; str_local = str_local + 1) {
    uVar1 = ((int)*str_local + result) * 0x401;
    result = uVar1 >> 6 ^ uVar1;
  }
  return (result * 9 >> 0xb ^ result * 9) * 0x8001;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW unsigned int hash_string(const char_t* str)
	{
		// Jenkins one-at-a-time hash (http://en.wikipedia.org/wiki/Jenkins_hash_function#one-at-a-time)
		unsigned int result = 0;

		while (*str)
		{
			result += static_cast<unsigned int>(*str++);
			result += result << 10;
			result ^= result >> 6;
		}

		result += result << 3;
		result ^= result >> 11;
		result += result << 15;

		return result;
	}